

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_MultipleInputs_Test::TestBody
          (CommandLineInterfaceTest_MultipleInputs_Test *this)

{
  string_view name;
  string_view name_00;
  string_view contents;
  string_view contents_00;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str = "syntax = \"proto2\";\nmessage Foo {}\n";
  contents._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  name_00._M_str = "bar.proto";
  name_00._M_len = 9;
  contents_00._M_str = "syntax = \"proto2\";\nmessage Bar {}\n";
  contents_00._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir --proto_path=$tmpdir foo.proto bar.proto"
             ,(allocator<char> *)&local_b8);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"test_generator",&local_b9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"foo.proto,bar.proto",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"foo.proto",&local_bb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Foo",&local_bc);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_b8,&local_58,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"test_generator",&local_b9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"foo.proto,bar.proto",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"bar.proto",&local_bb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Bar",&local_bc);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_b8,&local_58,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"test_plugin",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"foo.proto,bar.proto",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"foo.proto",&local_bb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Foo",&local_bc);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_b8,&local_58,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"test_plugin",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"foo.proto,bar.proto",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"bar.proto",&local_bb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Bar",&local_bc);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_b8,&local_58,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, MultipleInputs) {
  // Test parsing multiple input files.

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "message Bar {}\n");

  Run("protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir "
      "--proto_path=$tmpdir foo.proto bar.proto");

  ExpectNoErrors();
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");
}